

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

int helics::getPropertyIndex(string *val)

{
  pointer pcVar1;
  int iVar2;
  const_iterator pvVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined1 local_69;
  string local_68;
  string local_48;
  
  pvVar3 = frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::
           find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                     ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       *)propStringsTranslations,val,
                      (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      (propStringsTranslations + 0xe88),
                      (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      propStringsTranslations);
  if (pvVar3 == (const_iterator)(propStringsTranslations + 0x680)) {
    gmlc::utilities::makeLowerCase((string *)val);
    pvVar3 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::
             find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         *)propStringsTranslations,val,
                        (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        (propStringsTranslations + 0xe88),
                        (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        propStringsTranslations);
    if (pvVar3 == (const_iterator)(propStringsTranslations + 0x680)) {
      pcVar1 = (val->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + val->_M_string_length);
      iVar2 = getFlagIndex(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (-1 < iVar2) {
        return iVar2;
      }
      _Var4._M_current = (val->_M_dataplus)._M_p;
      local_69 = 0x5f;
      _Var4 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (_Var4,_Var4._M_current + val->_M_string_length,
                         (_Iter_equals_val<const_char>)&local_69);
      val->_M_string_length = (long)_Var4._M_current - (long)(val->_M_dataplus)._M_p;
      *_Var4._M_current = '\0';
      pvVar3 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::
               find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                           *)propStringsTranslations,val,
                          (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          (propStringsTranslations + 0xe88),
                          (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          propStringsTranslations);
      if (pvVar3 == (const_iterator)(propStringsTranslations + 0x680)) {
        pcVar1 = (val->_M_dataplus)._M_p;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar1,pcVar1 + val->_M_string_length);
        iVar2 = getFlagIndex(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p == &local_68.field_2) {
          return iVar2;
        }
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        return iVar2;
      }
    }
  }
  return pvVar3->second;
}

Assistant:

int getPropertyIndex(std::string val)
{
    const auto* fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    gmlc::utilities::makeLowerCase(val);
    fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    auto res = getFlagIndex(val);
    if (res >= 0) {
        return res;
    }
    val.erase(std::remove(val.begin(), val.end(), '_'), val.end());
    fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    return getFlagIndex(val);
}